

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpDef.cpp
# Opt level: O0

string * __thiscall
Liby::http::Reply::toString_abi_cxx11_(string *__return_storage_ptr__,Reply *this)

{
  bool bVar1;
  mapped_type *pmVar2;
  off_t oVar3;
  mapped_type *this_00;
  reference ppVar4;
  char *__first;
  char *pcVar5;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *header;
  iterator __end1;
  iterator __begin1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range1;
  key_type local_70;
  string local_50;
  allocator local_1a;
  undefined1 local_19;
  Reply *local_18;
  Reply *this_local;
  string *ret;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Reply *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"HTTP/1.1 ",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  pmVar2 = std::
           unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&status_number_abi_cxx11_,&this->status_);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)pmVar2);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
  pmVar2 = std::
           unordered_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&status_string_abi_cxx11_,&this->status_);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)pmVar2);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\r\n");
  bVar1 = Buffer::empty(&this->content_);
  if (!bVar1) {
    oVar3 = Buffer::size(&this->content_);
    std::__cxx11::to_string(&local_50,oVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_70,"Content-Length",(allocator *)((long)&__range1 + 7));
    this_00 = std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->headers_,&local_70);
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    std::__cxx11::string::~string((string *)&local_50);
  }
  __end1 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::begin(&this->headers_);
  header = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)std::
              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::end(&this->headers_);
  while (bVar1 = std::__detail::operator!=
                           (&__end1.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                            ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                              *)&header), bVar1) {
    ppVar4 = std::__detail::
             _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
             ::operator*(&__end1);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)ppVar4);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,": ");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&ppVar4->second);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\r\n");
    std::__detail::
    _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
    ::operator++(&__end1);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\r\n");
  bVar1 = Buffer::empty(&this->content_);
  if (!bVar1) {
    __first = Buffer::data(&this->content_);
    pcVar5 = Buffer::data(&this->content_);
    oVar3 = Buffer::size(&this->content_);
    std::__cxx11::string::append<char*,void>
              ((string *)__return_storage_ptr__,__first,pcVar5 + oVar3);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Reply::toString() {
    std::string ret = "HTTP/1.1 ";
    ret += status_number[status_];
    ret += " ";
    ret += status_string[status_];
    ret += "\r\n";
    if (!content_.empty()) {
        headers_["Content-Length"] = std::to_string(content_.size());
    }
    for (auto &header : headers_) {
        ret += header.first;
        ret += ": ";
        ret += header.second;
        ret += "\r\n";
    }
    ret += "\r\n";
    if (!content_.empty()) {
        ret.append(content_.data(), content_.data() + content_.size());
    }
    return ret;
}